

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bonk~.c
# Opt level: O1

void bonk_print(t_bonk *x,t_floatarg f)

{
  float fVar1;
  float fVar2;
  int iVar3;
  t_filterkernel *ptVar4;
  t_float *ptVar5;
  t_float *ptVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  
  post("thresh %f %f",(double)x->x_lothresh,(double)x->x_hithresh);
  post("mask %d %f",(double)x->x_maskdecay,(ulong)(uint)x->x_masktime);
  post("attack-frames %d",(ulong)(uint)x->x_attackbins);
  post("debounce %f",(double)x->x_debouncedecay);
  post("minvel %f",(double)x->x_minvel);
  post("spew %d",(ulong)(uint)x->x_spew);
  post("useloudness %d",(ulong)(uint)x->x_useloudness);
  post("number of templates %d",(ulong)(uint)x->x_ntemplate);
  if (x->x_learn != 0) {
    post("learn mode");
  }
  if ((f != 0.0) || (NAN(f))) {
    iVar3 = x->x_ninsig;
    if (0 < iVar3) {
      ptVar5 = x->x_insig->g_hist[0].h_mask;
      iVar8 = 0;
      do {
        if (iVar3 != 1) {
          post("input %d:",(ulong)(iVar8 + 1));
        }
        ptVar6 = ptVar5;
        for (iVar10 = x->x_nfilters; iVar10 != 0; iVar10 = iVar10 + -1) {
          post("pow %f mask %f before %f count %d",(double)((t_hist *)(ptVar6 + -4))->h_power,
               (double)ptVar6[x->x_maskphase],(double)ptVar6[-3],(ulong)(uint)ptVar6[-1]);
          ptVar6 = ptVar6 + 0xc;
        }
        iVar8 = iVar8 + 1;
        ptVar5 = ptVar5 + 0x966;
      } while (iVar8 != iVar3);
    }
    post("bin size %.2f Hz ... filters:",(double)(x->x_sr / (float)x->x_npoints));
    if (0 < x->x_nfilters) {
      lVar7 = 0x14;
      uVar9 = 0;
      do {
        ptVar4 = x->x_filterbank->b_vec;
        fVar1 = *(float *)((long)ptVar4 + lVar7 + -4);
        fVar2 = *(float *)((long)&ptVar4->k_filterpoints + lVar7);
        post("    %2d  cf %.2f(%.2f bins) bw %.2f(%.2f) nhops %d hop %d skip %d npoints %d",
             (double)((fVar1 * x->x_sr) / (float)x->x_npoints),(double)fVar1,
             (double)((x->x_sr * fVar2) / (float)x->x_npoints),(double)fVar2,uVar9 & 0xffffffff,
             (ulong)*(uint *)((long)ptVar4 + lVar7 + -8),
             (ulong)*(uint *)((long)ptVar4 + lVar7 + -0x10),
             (ulong)*(uint *)((long)ptVar4 + lVar7 + -0xc),
             (ulong)*(uint *)((long)ptVar4 + lVar7 + -0x14));
        uVar9 = uVar9 + 1;
        lVar7 = lVar7 + 0x20;
      } while ((long)uVar9 < (long)x->x_nfilters);
    }
  }
  if (x->x_debug != 0) {
    post("debug mode");
    return;
  }
  return;
}

Assistant:

static void bonk_print(t_bonk *x, t_floatarg f)
{
    int i;
    post("thresh %f %f", x->x_lothresh, x->x_hithresh);
    post("mask %d %f", x->x_masktime, x->x_maskdecay);
    post("attack-frames %d", x->x_attackbins);
    post("debounce %f", x->x_debouncedecay);
    post("minvel %f", x->x_minvel);
    post("spew %d", x->x_spew);
    post("useloudness %d", x->x_useloudness);
    
#if 0       /* LATER rewrite without hard-coded 11 filters */
    if (x->x_ntemplate)
    {
        post("templates:");
        for (i = 0; i < x->x_ntemplate; i++)
            post(
"%2d %5.2f %5.2f %5.2f %5.2f %5.2f %5.2f %5.2f %5.2f %5.2f %5.2f %5.2f",
                i,
                x->x_template[i].t_amp[0],
                x->x_template[i].t_amp[1],
                x->x_template[i].t_amp[2],
                x->x_template[i].t_amp[3],
                x->x_template[i].t_amp[4],
                x->x_template[i].t_amp[5],
                x->x_template[i].t_amp[6],
                x->x_template[i].t_amp[7],
                x->x_template[i].t_amp[8],
                x->x_template[i].t_amp[9],
                x->x_template[i].t_amp[10]);
    }
    else post("no templates");
#endif
    post("number of templates %d", x->x_ntemplate);
    if (x->x_learn) post("learn mode");
    if (f != 0)
    {
        int j, ninsig = x->x_ninsig;
        t_insig *gp;
        for (j = 0, gp = x->x_insig; j < ninsig; j++, gp++)
        {
            t_hist *h;
            if (ninsig > 1) post("input %d:", j+1);
            for (i = x->x_nfilters, h = gp->g_hist; i--; h++)
                post("pow %f mask %f before %f count %d",
                     h->h_power, h->h_mask[x->x_maskphase],
                     h->h_before, h->h_countup);
        }
        post("bin size %.2f Hz ... filters:",
             x->x_sr/x->x_npoints);
        for (j = 0; j < x->x_nfilters; j++)
            post("\
    %2d  cf %.2f(%.2f bins) bw %.2f(%.2f) nhops %d hop %d skip %d npoints %d",
                 j, 
                 x->x_filterbank->b_vec[j].k_centerfreq*x->x_sr/x->x_npoints,
                 x->x_filterbank->b_vec[j].k_centerfreq,
                 x->x_filterbank->b_vec[j].k_bandwidth*x->x_sr/x->x_npoints,
                 x->x_filterbank->b_vec[j].k_bandwidth,
                 x->x_filterbank->b_vec[j].k_nhops,
                 x->x_filterbank->b_vec[j].k_hoppoints,
                 x->x_filterbank->b_vec[j].k_skippoints,
                 x->x_filterbank->b_vec[j].k_filterpoints);
    }
    if (x->x_debug) post("debug mode");
}